

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmCommonTargetGenerator::AddFeatureFlags(cmCommonTargetGenerator *this,string *flags,string *lang)

{
  bool bVar1;
  allocator local_41;
  string local_40;
  string *local_20;
  string *lang_local;
  string *flags_local;
  cmCommonTargetGenerator *this_local;
  
  local_20 = lang;
  lang_local = flags;
  flags_local = (string *)this;
  cmLocalGenerator::AddLanguageFlags
            (&this->LocalGenerator->super_cmLocalGenerator,flags,lang,&this->ConfigName);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"INTERPROCEDURAL_OPTIMIZATION",&local_41);
  bVar1 = GetFeatureAsBool(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if (bVar1) {
    cmLocalGenerator::AppendFeatureOptions
              (&this->LocalGenerator->super_cmLocalGenerator,lang_local,local_20,"IPO");
  }
  return;
}

Assistant:

void cmCommonTargetGenerator::AddFeatureFlags(
  std::string& flags, const std::string& lang
  )
{
  // Add language-specific flags.
  this->LocalGenerator->AddLanguageFlags(flags, lang, this->ConfigName);

  if(this->GetFeatureAsBool("INTERPROCEDURAL_OPTIMIZATION"))
    {
    this->LocalGenerator->AppendFeatureOptions(flags, lang, "IPO");
    }
}